

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void * ecs_get_w_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component)

{
  _Bool _Var1;
  undefined7 extraout_var;
  void *pvVar2;
  ecs_entity_t component_00;
  ecs_entity_info_t info;
  ecs_world_t *local_48;
  undefined1 local_40 [32];
  
  local_48 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x7d7);
  if (local_48 == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x7d7,"const void *ecs_get_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)");
  }
  ecs_get_stage(&local_48);
  _ecs_assert(local_48->magic == 0x65637377,0xc,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x7dc);
  if (local_48->magic == 0x65637377) {
    _Var1 = ecs_get_info(local_48,entity,(ecs_entity_info_t *)local_40);
    component_00 = CONCAT71(extraout_var,_Var1) & 0xffffffff;
    pvVar2 = (void *)0x0;
    if (((char)component_00 != '\0') && ((ecs_table_t *)local_40._8_8_ != (ecs_table_t *)0x0)) {
      pvVar2 = get_component((ecs_entity_info_t *)local_40,component);
      if ((pvVar2 == (void *)0x0) &&
         ((pvVar2 = (void *)0x0, component != 6 && (component != 0x101)))) {
        pvVar2 = get_base_component(local_48,(ecs_stage_t *)local_40,(ecs_entity_info_t *)component,
                                    component_00);
      }
    }
    return pvVar2;
  }
  __assert_fail("world->magic == (0x65637377)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x7dc,"const void *ecs_get_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)");
}

Assistant:

const void* ecs_get_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_entity_info_t info;
    void *ptr = NULL;

    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INTERNAL_ERROR, NULL);

    bool found = ecs_get_info(world, entity, &info);
    if (found) {
        if (!info.table) {
            return NULL;
        }

        ptr = get_component(&info, component);
        if (!ptr) {
            if (component != ecs_typeid(EcsName) && component != EcsPrefab) {
                ptr = get_base_component(
                    world, stage, &info, component);
            }
        }        
    }

    return ptr;
}